

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O0

void __thiscall
helix::parity::pmd_handler::process_msg(pmd_handler *this,pmd_order_deleted *m,bool sync)

{
  bool bVar1;
  __uint32_t _Var2;
  pointer ppVar3;
  byte in_DL;
  long in_RSI;
  order_book *in_RDI;
  uint64_t timestamp;
  order_book *ob;
  iterator it;
  uint64_t order_id;
  event *in_stack_ffffffffffffff58;
  function<void_(const_helix::event_&)> *this_00;
  uint64_t in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  function<void_(const_helix::event_&)> local_80 [2];
  uint64_t local_40;
  order_book *local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_28;
  char *local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_20 = (char *)__bswap_64(*(__uint64_t *)(in_RSI + 5));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::find((unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
               *)in_stack_ffffffffffffff58,(key_type *)0x152a7e);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::end((unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
              *)in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>
                         *)0x152ac1);
    local_38 = ppVar3->second;
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 1));
    local_40 = to_timestamp((pmd_handler *)in_RDI,(ulong)_Var2);
    order_book::remove(local_38,local_20);
    order_book::set_timestamp(local_38,local_40);
    if ((local_11 & 1) != 0) {
      order_book::symbol_abi_cxx11_(local_38);
      this_00 = local_80;
      make_ob_event(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_RDI,
                    (event_mask)((ulong)this_00 >> 0x20));
      std::function<void_(const_helix::event_&)>::operator()(this_00,in_stack_ffffffffffffff58);
      event::~event((event *)0x152b5c);
    }
  }
  return;
}

Assistant:

void pmd_handler::process_msg(const pmd_order_deleted* m, bool sync)
{
    uint64_t order_id = be64toh(m->OrderNumber);
    auto it = _order_id_map.find(order_id);
    if (it != _order_id_map.end()) {
        auto& ob = it->second;
        uint64_t timestamp = to_timestamp(be32toh(m->Timestamp));
        ob.remove(order_id);
        ob.set_timestamp(timestamp);
        if (sync) {
            _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
        }
    }
}